

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O0

void __thiscall
helics::BaseTimeCoordinator::enteringExecMode(BaseTimeCoordinator *this,IterationRequest param_2)

{
  bool bVar1;
  ActionMessage *in_RDI;
  DependencyInfo *dep;
  iterator __end1;
  iterator __begin1;
  TimeDependencies *__range1;
  bool fedOnly;
  ActionMessage error;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> res;
  ActionMessage *in_stack_fffffffffffffed0;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_120;
  undefined8 in_stack_fffffffffffffee8;
  action_t startingAction;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  byte bVar2;
  undefined4 in_stack_fffffffffffffef8;
  int iVar3;
  undefined4 uVar4;
  GlobalFederateId local_100;
  undefined1 in_stack_ffffffffffffff07;
  TimeDependencies *in_stack_ffffffffffffff08;
  BaseTimeCoordinator *in_stack_ffffffffffffffc0;
  int local_38;
  
  startingAction = (action_t)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  if (((in_RDI->payload).buffer._M_elems[0x13] & 1) == 0) {
    (in_RDI->payload).buffer._M_elems[0x12] = 1;
    bVar1 = TimeDependencies::empty((TimeDependencies *)0x630ad1);
    if (!bVar1) {
      (**(code **)(*(long *)in_RDI + 0x10))();
      TimeDependencies::checkForIssues_abi_cxx11_
                (in_stack_ffffffffffffff08,(bool)in_stack_ffffffffffffff07);
      if (local_38 == 0) {
        iVar3 = 0;
      }
      else {
        ActionMessage::ActionMessage
                  ((ActionMessage *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                   startingAction);
        uVar4 = 0;
        GlobalFederateId::GlobalFederateId(&local_100,(GlobalBrokerId)0x0);
        SmallBuffer::operator=
                  ((SmallBuffer *)CONCAT44(uVar4,in_stack_fffffffffffffef8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
        std::function<void_(const_helics::ActionMessage_&)>::operator()
                  ((function<void_(const_helics::ActionMessage_&)> *)in_stack_fffffffffffffed0,
                   in_RDI);
        iVar3 = 1;
        ActionMessage::~ActionMessage(in_stack_fffffffffffffed0);
      }
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x630bcb);
      if (iVar3 != 0) {
        return;
      }
    }
    bVar2 = 1;
    (in_RDI->payload).buffer._M_elems[0x10] = 1;
    local_120._M_current = (DependencyInfo *)TimeDependencies::begin((TimeDependencies *)in_RDI);
    TimeDependencies::end((TimeDependencies *)in_RDI);
    while (bVar1 = __gnu_cxx::
                   operator==<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                             ((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                               *)in_stack_fffffffffffffed0,
                              (__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                               *)in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
      in_stack_fffffffffffffed0 =
           (ActionMessage *)
           __gnu_cxx::
           __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
           ::operator*(&local_120);
      if ((in_stack_fffffffffffffed0->payload).buffer._M_elems[0xd] == 1) {
        bVar2 = 0;
        (in_RDI->payload).buffer._M_elems[0x10] = 0;
        break;
      }
      if (((in_stack_fffffffffffffed0->payload).buffer._M_elems[0xd] == 2) &&
         (bVar1 = GlobalFederateId::isBroker
                            ((GlobalFederateId *)
                             ((in_stack_fffffffffffffed0->payload).buffer._M_elems + 8)), bVar1)) {
        bVar2 = 0;
      }
      __gnu_cxx::
      __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
      ::operator++(&local_120);
    }
    (in_RDI->payload).buffer._M_elems[0x11] = bVar2 & 1;
    sendTimingInfo(in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void BaseTimeCoordinator::enteringExecMode(IterationRequest /*mode*/)
{
    if (executionMode) {
        return;
    }
    checkingExec = true;
    if (!dependencies.empty()) {
        updateTimeFactors();
        auto res = dependencies.checkForIssues(false);
        if (res.first != 0) {
            ActionMessage error(CMD_GLOBAL_ERROR);
            error.dest_id = parent_broker_id;
            error.source_id = mSourceId;
            error.messageID = res.first;
            error.payload = res.second;
            sendMessageFunction(error);
            return;
        }
    }
    bool fedOnly = true;
    noParent = true;
    for (const auto& dep : dependencies) {
        if (dep.connection == ConnectionType::PARENT) {
            fedOnly = false;
            noParent = false;
            break;
        }
        if (dep.connection == ConnectionType::CHILD && dep.fedID.isBroker()) {
            fedOnly = false;
        }
    }
    federatesOnly = fedOnly;
    sendTimingInfo();
}